

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall
Am_Value_List::Insert(Am_Value_List *this,char *value,Am_Insert_Position position,bool unique)

{
  Am_Value_List_Data *this_00;
  Am_Value store;
  
  if (this->data == (Am_Value_List_Data *)0x0) {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Am_Value::Am_Value(&store,value);
  Am_Value_List_Data::Insert(this->data,&store,this->item,position);
  Am_Value::~Am_Value(&store);
  return;
}

Assistant:

void Am_Value_List::Insert(const Am_Value &value,
                                           Am_Insert_Position position,
                                           bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();
  data->Insert(value, item, position);
}